

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::ItemSize(ImVec2 *size,float text_offset_y)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->Accessed = true;
  if (pIVar3->SkipItems == false) {
    fVar1 = (pIVar3->DC).CurrentLineHeight;
    uVar5 = -(uint)(size->y <= fVar1);
    fVar7 = (float)(~uVar5 & (uint)size->y | (uint)fVar1 & uVar5);
    fVar1 = (pIVar3->DC).CurrentLineTextBaseOffset;
    uVar5 = -(uint)(text_offset_y <= fVar1);
    fVar2 = (pIVar3->Pos).x;
    fVar9 = (pIVar3->DC).CursorPos.x + size->x;
    fVar8 = (pIVar3->DC).CursorPos.y;
    (pIVar3->DC).CursorPosPrevLine.x = fVar9;
    (pIVar3->DC).CursorPosPrevLine.y = fVar8;
    fVar8 = (float)(int)(fVar7 + fVar8 + (pIVar4->Style).ItemSpacing.y);
    (pIVar3->DC).CursorPos.x =
         (float)(int)(fVar2 + (pIVar3->DC).IndentX + (pIVar3->DC).ColumnsOffsetX);
    (pIVar3->DC).CursorPos.y = fVar8;
    fVar2 = (pIVar3->DC).CursorMaxPos.x;
    uVar6 = -(uint)(fVar9 <= fVar2);
    (pIVar3->DC).CursorMaxPos.x = (float)(uVar6 & (uint)fVar2 | ~uVar6 & (uint)fVar9);
    fVar2 = (pIVar3->DC).CursorMaxPos.y;
    uVar6 = -(uint)(fVar8 <= fVar2);
    (pIVar3->DC).CursorMaxPos.y = (float)(uVar6 & (uint)fVar2 | ~uVar6 & (uint)fVar8);
    (pIVar3->DC).PrevLineHeight = fVar7;
    (pIVar3->DC).PrevLineTextBaseOffset =
         (float)(~uVar5 & (uint)text_offset_y | (uint)fVar1 & uVar5);
    (pIVar3->DC).CurrentLineHeight = 0.0;
    (pIVar3->DC).CurrentLineTextBaseOffset = 0.0;
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }